

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmCacheManager *pcVar1;
  cmState *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  cmGlobalGenerator *pcVar7;
  cmGlobalUnixMakefileGenerator3 *this_01;
  int iVar8;
  string fullName;
  allocator local_69;
  string local_68;
  allocator local_41;
  string local_40;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  iVar8 = -2;
  if (this->CurrentWorkingMode == NORMAL_MODE) {
    iVar4 = DoPreConfigureChecks(this);
    if (iVar4 < 0) {
      return -2;
    }
    if (iVar4 == 0) goto LAB_0037d4f8;
  }
  else {
LAB_0037d4f8:
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_HOME_DIRECTORY",(allocator *)&local_68);
    pcVar5 = GetHomeDirectory(this);
    cmCacheManager::AddCacheEntry
              (pcVar1,&fullName,pcVar5,
               "Source directory with the top level CMakeLists.txt file for this project",INTERNAL);
    std::__cxx11::string::~string((string *)&fullName);
  }
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
    pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator *)&local_68)
    ;
    pcVar6 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_68,pcVar5,&local_69);
      pcVar5 = "";
      if (pcVar6 != (char *)0x0) {
        pcVar5 = pcVar6;
      }
      std::__cxx11::string::string((string *)&local_40,pcVar5,&local_41);
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&fullName,&local_68,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_68);
      pcVar7 = CreateGlobalGenerator(this,&fullName);
      this->GlobalGenerator = pcVar7;
      std::__cxx11::string::~string((string *)&fullName);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      this_01 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x668);
      cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_01,this);
      SetGlobalGenerator(this,(cmGlobalGenerator *)this_01);
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    else {
      cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
    }
  }
  pcVar1 = this->CacheManager;
  std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
  pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
  std::__cxx11::string::~string((string *)&fullName);
  if (pcVar5 == (char *)0x0) {
LAB_0037d6ff:
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
    pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar5 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_40);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&local_68);
      cmCacheManager::AddCacheEntry
                (pcVar1,&fullName,local_68._M_dataplus._M_p,"Name of generator.",INTERNAL);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
      pcVar1 = this->CacheManager;
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator *)&local_40);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_68,this->GlobalGenerator);
      cmCacheManager::AddCacheEntry
                (pcVar1,&fullName,local_68._M_dataplus._M_p,
                 "Name of external makefile project generator.",INTERNAL);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
    }
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator *)&local_68);
    pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar5 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_GENERATOR_PLATFORM",(allocator *)&local_68);
      cmCacheManager::AddCacheEntry
                (pcVar1,&fullName,(this->GeneratorPlatform)._M_dataplus._M_p,
                 "Name of generator platform.",INTERNAL);
      std::__cxx11::string::~string((string *)&fullName);
    }
    else if ((this->GeneratorPlatform)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&this->GeneratorPlatform);
    }
    else {
      bVar3 = std::operator!=(&this->GeneratorPlatform,pcVar5);
      if (bVar3) {
        std::__cxx11::string::string
                  ((string *)&fullName,"Error: generator platform: ",(allocator *)&local_68);
        std::__cxx11::string::append((string *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        goto LAB_0037da4b;
      }
    }
    pcVar1 = this->CacheManager;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator *)&local_68);
    pcVar5 = cmCacheManager::GetInitializedCacheValue(pcVar1,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar5 == (char *)0x0) {
      pcVar1 = this->CacheManager;
      std::__cxx11::string::string
                ((string *)&fullName,"CMAKE_GENERATOR_TOOLSET",(allocator *)&local_68);
      cmCacheManager::AddCacheEntry
                (pcVar1,&fullName,(this->GeneratorToolset)._M_dataplus._M_p,
                 "Name of generator toolset.",INTERNAL);
      std::__cxx11::string::~string((string *)&fullName);
    }
    else if ((this->GeneratorToolset)._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&this->GeneratorToolset);
    }
    else {
      bVar3 = std::operator!=(&this->GeneratorToolset,pcVar5);
      if (bVar3) {
        std::__cxx11::string::string
                  ((string *)&fullName,"Error: generator toolset: ",(allocator *)&local_68);
        std::__cxx11::string::append((string *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        std::__cxx11::string::append((char *)&fullName);
        cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        goto LAB_0037da4b;
      }
    }
    bVar3 = cmState::GetIsInTryCompile(this->State);
    if (!bVar3) {
      cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
      TruncateOutputLog(this,"CMakeOutput.log");
      TruncateOutputLog(this,"CMakeError.log");
    }
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[7])();
    pcVar2 = this->State;
    std::__cxx11::string::string
              ((string *)&fullName,"CMAKE_BACKWARDS_COMPATIBILITY",(allocator *)&local_68);
    pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if (pcVar5 != (char *)0x0) {
      pcVar2 = this->State;
      std::__cxx11::string::string((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator *)&local_68)
      ;
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar5 == (char *)0x0) {
        pcVar2 = this->State;
        std::__cxx11::string::string
                  ((string *)&fullName,"LIBRARY_OUTPUT_PATH",(allocator *)&local_68);
        cmState::AddCacheEntry
                  (pcVar2,&fullName,"","Single output directory for building all libraries.",PATH);
        std::__cxx11::string::~string((string *)&fullName);
      }
      pcVar2 = this->State;
      std::__cxx11::string::string
                ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_68);
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar5 == (char *)0x0) {
        pcVar2 = this->State;
        std::__cxx11::string::string
                  ((string *)&fullName,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_68);
        cmState::AddCacheEntry
                  (pcVar2,&fullName,"","Single output directory for building all executables.",PATH)
        ;
        std::__cxx11::string::~string((string *)&fullName);
      }
    }
    bVar3 = cmSystemTools::GetFatalErrorOccured();
    if (bVar3) {
      pcVar2 = this->State;
      std::__cxx11::string::string((string *)&fullName,"CMAKE_MAKE_PROGRAM",(allocator *)&local_68);
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
      if ((pcVar5 == (char *)0x0) || (bVar3 = cmSystemTools::IsOff(pcVar5), bVar3)) {
        pcVar2 = this->State;
        std::__cxx11::string::string((string *)&fullName,"CMAKE_GENERATOR",(allocator *)&local_68);
        cmState::RemoveCacheEntry(pcVar2,&fullName);
        std::__cxx11::string::~string((string *)&fullName);
        pcVar2 = this->State;
        std::__cxx11::string::string
                  ((string *)&fullName,"CMAKE_EXTRA_GENERATOR",(allocator *)&local_68);
        cmState::RemoveCacheEntry(pcVar2,&fullName);
        std::__cxx11::string::~string((string *)&fullName);
      }
    }
    this_00 = (*(this->GlobalGenerator->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start)->Makefile;
    std::__cxx11::string::string((string *)&fullName,"CTEST_USE_LAUNCHERS",(allocator *)&local_40);
    bVar3 = cmMakefile::IsOn(this_00,&fullName);
    if (bVar3) {
      pcVar2 = this->State;
      std::__cxx11::string::string((string *)&local_68,"RULE_LAUNCH_COMPILE",&local_69);
      pcVar5 = cmState::GetGlobalProperty(pcVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&fullName);
      if (pcVar5 == (char *)0x0) {
        cmSystemTools::Error
                  ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
      }
    }
    else {
      std::__cxx11::string::~string((string *)&fullName);
    }
    if (this->CurrentWorkingMode == NORMAL_MODE) {
      pcVar1 = this->CacheManager;
      pcVar5 = GetHomeOutputDirectory(this);
      std::__cxx11::string::string((string *)&fullName,pcVar5,(allocator *)&local_68);
      cmCacheManager::SaveCache(pcVar1,&fullName);
      std::__cxx11::string::~string((string *)&fullName);
    }
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    iVar8 = -(uint)bVar3;
  }
  else {
    pcVar7 = this->GlobalGenerator;
    std::__cxx11::string::string((string *)&fullName,pcVar5,(allocator *)&local_68);
    iVar4 = (*pcVar7->_vptr_cmGlobalGenerator[3])(pcVar7,&fullName);
    std::__cxx11::string::~string((string *)&fullName);
    if ((char)iVar4 != '\0') goto LAB_0037d6ff;
    std::__cxx11::string::string((string *)&fullName,"Error: generator : ",(allocator *)&local_68);
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[2])(&local_68);
    std::__cxx11::string::append((string *)&fullName);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    std::__cxx11::string::append((char *)&fullName);
    cmSystemTools::Error(fullName._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0037da4b:
    std::__cxx11::string::~string((string *)&fullName);
  }
  return iVar8;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    res = this->DoPreConfigureChecks();
    }
  if ( res < 0 )
    {
    return -2;
    }
  if ( !res )
    {
    this->CacheManager->AddCacheEntry
      ("CMAKE_HOME_DIRECTORY",
       this->GetHomeDirectory(),
       "Source directory with the top level CMakeLists.txt file for this "
       "project",
       cmState::INTERNAL);
    }

  // no generator specified on the command line
  if(!this->GlobalGenerator)
    {
    const char* genName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->CacheManager->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if(genName)
      {
      std::string fullName = cmExternalMakefileProjectGenerator::
                                CreateFullGeneratorName(genName,
                                    extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
      }
    if(this->GlobalGenerator)
      {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths
        (this->GlobalGenerator->GetForceUnixPaths());
      }
    else
      {
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
      std::string installedCompiler;
      // Try to find the newest VS installed on the computer and
      // use that as a default if -G is not specified
      const std::string vsregBase =
        "[HKEY_LOCAL_MACHINE\\SOFTWARE\\Microsoft\\";
      std::vector<std::string> vsVerions;
      vsVerions.push_back("VisualStudio\\");
      vsVerions.push_back("VCExpress\\");
      vsVerions.push_back("WDExpress\\");
      struct VSRegistryEntryName
      {
        const char* MSVersion;
        const char* GeneratorName;
      };
      VSRegistryEntryName version[] = {
        {"6.0", "Visual Studio 6"},
        {"7.0", "Visual Studio 7"},
        {"7.1", "Visual Studio 7 .NET 2003"},
        {"8.0", "Visual Studio 8 2005"},
        {"9.0", "Visual Studio 9 2008"},
        {"10.0", "Visual Studio 10 2010"},
        {"11.0", "Visual Studio 11 2012"},
        {"12.0", "Visual Studio 12 2013"},
        {"14.0", "Visual Studio 14 2015"},
        {0, 0}};
      for(int i=0; version[i].MSVersion != 0; i++)
        {
        for(size_t b=0; b < vsVerions.size(); b++)
          {
          std::string reg = vsregBase + vsVerions[b] + version[i].MSVersion;
          reg += ";InstallDir]";
          cmSystemTools::ExpandRegistryValues(reg,
                                              cmSystemTools::KeyWOW64_32);
          if (!(reg == "/registry"))
            {
            installedCompiler = version[i].GeneratorName;
            break;
            }
          }
        }
      cmGlobalGenerator* gen
        = this->CreateGlobalGenerator(installedCompiler.c_str());
      if(!gen)
        {
        gen = new cmGlobalNMakeMakefileGenerator(this);
        }
      this->SetGlobalGenerator(gen);
      std::cout << "-- Building for: " << gen->GetName() << "\n";
#else
      this->SetGlobalGenerator(new cmGlobalUnixMakefileGenerator3(this));
#endif
      }
    if(!this->GlobalGenerator)
      {
      cmSystemTools::Error("Could not create generator");
      return -1;
      }
    }

  const char* genName = this->CacheManager
                            ->GetInitializedCacheValue("CMAKE_GENERATOR");
  if(genName)
    {
    if(!this->GlobalGenerator->MatchesGeneratorName(genName))
      {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  if(!this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR"))
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR",
                                      this->GlobalGenerator->GetName().c_str(),
                                      "Name of generator.",
                                      cmState::INTERNAL);
    this->CacheManager->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmState::INTERNAL);
    }

  if(const char* platformName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM"))
    {
    if(this->GeneratorPlatform.empty())
      {
      this->GeneratorPlatform = platformName;
      }
    else if(this->GeneratorPlatform != platformName)
      {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                                      this->GeneratorPlatform.c_str(),
                                      "Name of generator platform.",
                                      cmState::INTERNAL);
    }

  if(const char* tsName =
     this->CacheManager->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET"))
    {
    if(this->GeneratorToolset.empty())
      {
      this->GeneratorToolset = tsName;
      }
    else if(this->GeneratorToolset != tsName)
      {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message +=
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    this->CacheManager->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                                      this->GeneratorToolset.c_str(),
                                      "Name of generator toolset.",
                                      cmState::INTERNAL);
    }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile())
    {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
    }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if(this->State
         ->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY"))
    {
    if(!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("LIBRARY_OUTPUT_PATH", "",
         "Single output directory for building all libraries.",
         cmState::PATH);
      }
    if(!this->State
            ->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH"))
      {
      this->State->AddCacheEntry
        ("EXECUTABLE_OUTPUT_PATH", "",
         "Single output directory for building all executables.",
         cmState::PATH);
      }
    }

  if(cmSystemTools::GetFatalErrorOccured())
    {
    const char* makeProgram =
        this->State->GetInitializedCacheValue("CMAKE_MAKE_PROGRAM");
    if (!makeProgram || cmSystemTools::IsOff(makeProgram))
      {
      // We must have a bad generator selection.  Wipe the cache entry so the
      // user can select another.
      this->State->RemoveCacheEntry("CMAKE_GENERATOR");
      this->State->RemoveCacheEntry("CMAKE_EXTRA_GENERATOR");
      }
    }

  cmMakefile* mf=this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  if (mf->IsOn("CTEST_USE_LAUNCHERS")
              && !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE"))
    {
    cmSystemTools::Error("CTEST_USE_LAUNCHERS is enabled, but the "
                        "RULE_LAUNCH_COMPILE global property is not defined.\n"
                        "Did you forget to include(CTest) in the toplevel "
                         "CMakeLists.txt ?");
    }

  // only save the cache if there were no fatal errors
  if ( this->GetWorkingMode() == NORMAL_MODE )
    {
    this->CacheManager->SaveCache(this->GetHomeOutputDirectory());
    }
  if(cmSystemTools::GetErrorOccuredFlag())
    {
    return -1;
    }
  return 0;
}